

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_NtkIsTopoOrder(Cba_Ntk_t *p)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  void *__s;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar6 = (p->vObjType).nSize;
  iVar8 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 * 4);
  }
  iVar9 = iVar8 * 0x20;
  memset(__s,0,(long)iVar8 << 2);
  lVar7 = (long)(p->vInputs).nSize;
  if (0 < lVar7) {
    piVar4 = (p->vInputs).pArray;
    lVar10 = 0;
    do {
      uVar6 = piVar4[lVar10];
      if (((int)uVar6 < 0) || (iVar9 <= (int)uVar6)) goto LAB_003d466d;
      puVar1 = (uint *)((long)__s + (ulong)(uVar6 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar6 & 0x1f);
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  lVar7 = (long)(p->vSeq).nSize;
  if (0 < lVar7) {
    piVar4 = (p->vSeq).pArray;
    lVar10 = 0;
    do {
      uVar6 = piVar4[lVar10];
      if (((int)uVar6 < 0) || (iVar9 <= (int)uVar6)) goto LAB_003d466d;
      puVar1 = (uint *)((long)__s + (ulong)(uVar6 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar6 & 0x1f);
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  if (1 < (p->vObjType).nSize) {
    uVar14 = 1;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vObjType).pArray[uVar14];
      if (0xffffffa8 < bVar2 - 0x5a) {
        if (bVar2 == 3) {
          if ((p->vObjFunc).nSize < 1) {
            uVar6 = 0;
          }
          else {
            Vec_IntFillExtra(&p->vObjFunc,(int)uVar14 + 1,0);
            if ((long)(p->vObjFunc).nSize <= (long)uVar14) goto LAB_003d4610;
            uVar6 = (p->vObjFunc).pArray[uVar14];
          }
          uVar6 = *(uint *)((long)(p->pDesign->vNtks).pArray[uVar6] + 0x14) >> 2 & 1;
        }
        else {
          uVar6 = (uint)(bVar2 - 0x4c < 0xc);
        }
        if (uVar6 == 0) {
          lVar7 = (long)(p->vObjFin0).nSize;
          if ((lVar7 <= (long)uVar14) || (lVar7 <= (long)(uVar14 + 1))) goto LAB_003d4610;
          piVar4 = (p->vObjFin0).pArray;
          uVar6 = piVar4[uVar14];
          uVar11 = (ulong)uVar6;
          bVar5 = true;
          while ((int)uVar11 < piVar4[uVar14 + 1]) {
            if ((int)uVar6 < 1) goto LAB_003d462f;
            if ((p->vFinFon).nSize <= (int)uVar11) goto LAB_003d4610;
            iVar8 = (p->vFinFon).pArray[uVar11];
            if ((long)iVar8 < 1) {
              uVar12 = 0;
            }
            else {
              if ((p->vFonObj).nSize <= iVar8) goto LAB_003d4610;
              uVar12 = (p->vFonObj).pArray[iVar8];
            }
            if (uVar12 != 0) {
              if (((int)uVar12 < 0) || (iVar9 <= (int)uVar12)) goto LAB_003d464e;
              if ((*(uint *)((long)__s + (ulong)(uVar12 >> 5) * 4) >> (uVar12 & 0x1f) & 1) == 0) {
                bVar5 = false;
              }
            }
            uVar11 = uVar11 + 1;
            if (lVar7 <= (long)(uVar14 + 1)) goto LAB_003d4610;
          }
          if (!bVar5) goto LAB_003d45f0;
          if ((long)iVar9 <= (long)uVar14) {
LAB_003d466d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          puVar1 = (uint *)((long)__s + (uVar14 >> 5 & 0x7ffffff) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar14 & 0x1f);
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)(p->vObjType).nSize);
  }
  lVar7 = (long)(p->vOutputs).nSize;
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      uVar6 = (p->vOutputs).pArray[lVar10];
      if ((int)uVar6 < 1) goto LAB_003d468c;
      iVar8 = (p->vObjFin0).nSize;
      if ((iVar8 <= (int)uVar6) || (iVar8 <= (int)(uVar6 + 1))) goto LAB_003d4610;
      piVar4 = (p->vObjFin0).pArray;
      uVar12 = piVar4[uVar6];
      uVar14 = (ulong)uVar12;
      bVar5 = true;
      while ((int)uVar14 < piVar4[(ulong)uVar6 + 1]) {
        if ((int)uVar12 < 1) goto LAB_003d462f;
        if ((p->vFinFon).nSize <= (int)uVar14) goto LAB_003d4610;
        iVar3 = (p->vFinFon).pArray[uVar14];
        if ((long)iVar3 < 1) {
          uVar13 = 0;
        }
        else {
          if ((p->vFonObj).nSize <= iVar3) goto LAB_003d4610;
          uVar13 = (p->vFonObj).pArray[iVar3];
        }
        if (uVar13 != 0) {
          if (((int)uVar13 < 0) || (iVar9 <= (int)uVar13)) goto LAB_003d464e;
          if ((*(uint *)((long)__s + (ulong)(uVar13 >> 5) * 4) >> (uVar13 & 0x1f) & 1) == 0) {
            bVar5 = false;
          }
        }
        uVar14 = uVar14 + 1;
        if (iVar8 <= (int)(uVar6 + 1)) goto LAB_003d4610;
      }
      if (!bVar5) goto LAB_003d45f0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar7);
  }
  lVar7 = (long)(p->vSeq).nSize;
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      uVar6 = (p->vSeq).pArray[lVar10];
      if ((int)uVar6 < 1) {
LAB_003d468c:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe7,"int Cba_ObjFin0(Cba_Ntk_t *, int)");
      }
      iVar8 = (p->vObjFin0).nSize;
      if ((iVar8 <= (int)uVar6) || (iVar8 <= (int)(uVar6 + 1))) {
LAB_003d4610:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = (p->vObjFin0).pArray;
      uVar12 = piVar4[uVar6];
      uVar14 = (ulong)uVar12;
      bVar5 = true;
      while ((int)uVar14 < piVar4[(ulong)uVar6 + 1]) {
        if ((int)uVar12 < 1) {
LAB_003d462f:
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= (int)uVar14) goto LAB_003d4610;
        iVar3 = (p->vFinFon).pArray[uVar14];
        if ((long)iVar3 < 1) {
          uVar13 = 0;
        }
        else {
          if ((p->vFonObj).nSize <= iVar3) goto LAB_003d4610;
          uVar13 = (p->vFonObj).pArray[iVar3];
        }
        if (uVar13 != 0) {
          if (((int)uVar13 < 0) || (iVar9 <= (int)uVar13)) {
LAB_003d464e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if ((*(uint *)((long)__s + (ulong)(uVar13 >> 5) * 4) >> (uVar13 & 0x1f) & 1) == 0) {
            bVar5 = false;
          }
        }
        uVar14 = uVar14 + 1;
        if (iVar8 <= (int)(uVar6 + 1)) goto LAB_003d4610;
      }
      if (!bVar5) goto LAB_003d45f0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar7);
  }
  iVar8 = 1;
LAB_003d45f2:
  if (__s != (void *)0x0) {
    free(__s);
  }
  return iVar8;
LAB_003d45f0:
  iVar8 = 0;
  goto LAB_003d45f2;
}

Assistant:

int Cba_NtkIsTopoOrder( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin, fTopo = 1;
    Vec_Bit_t * vVisited = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    // mark PIs and seq objects
    Cba_NtkForEachPi( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    // visit combinational nodes
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
        {
            Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
                if ( !Vec_BitEntry(vVisited, iFanin) )
                    fTopo = 0;
            if ( !fTopo )
                break;
            Vec_BitWriteEntry( vVisited, iObj, 1 );
        }
    // visit POs and seq objects
    if ( fTopo )
    Cba_NtkForEachPo( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    if ( fTopo )
    Cba_NtkForEachBoxSeq( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    Vec_BitFree( vVisited );
    return fTopo;
}